

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

uint32_t prf_state_color_lookup(prf_state_t *state,uint index,int intensity)

{
  prf_node_t *ppVar1;
  uint uVar2;
  uint32_t *puVar3;
  int iVar4;
  int iVar5;
  
  ppVar1 = state->color_palette;
  puVar3 = prf_color_palette_default_values;
  if (ppVar1 != (prf_node_t *)0x0) {
    iVar5 = ppVar1->length - 0x84;
    iVar4 = ppVar1->length - 0x81;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    if ((int)index < iVar4 >> 2) {
      puVar3 = (uint32_t *)(ppVar1->data + 0x80);
    }
  }
  uVar2 = puVar3[index];
  if (uVar2 < 0xff000000) {
    uVar2 = prf_color_palette_default_values[index];
  }
  return uVar2;
}

Assistant:

uint32_t
prf_state_color_lookup(
    prf_state_t * state,
    unsigned int index,
    int intensity )
{
    uint32_t color;

    assert( state != NULL );
    assert( index < 1024 );

    color = 0;

    if ( /* (intensity != 0) && */
         (state->color_palette != NULL) &&
         ((signed int) index < ((state->color_palette->length - 132) / 4)) ) {
        struct prf_color_palette_data * data;
        data = (struct prf_color_palette_data *) state->color_palette->data;
        color = data->brightest_rgb[index];
    } else {
        color = prf_color_palette_default_values[ index ];
    }

    if ( (color & 0xff000000) != 0xff000000 ) {
        color = prf_color_palette_default_values[ index ];
    }

    /*
    if ( (intensity == 0) || (color == 0)) {
        color = prf_color_palette_default_values[index];
    } else if (0) {
      int b,g,r;
      int a0,a1,r0,r1,b0,b1,g0,g1;
      uint32_t defcol = prf_color_palette_default_values[index];
 
      extract_components(defcol, &a0, &b0, &g0, &r0);
      extract_components(color, &a1, &b1, &g1, &r1);

      a0 = 255 - a1;
      
      b = (b0 * a0 + b1 * a1) >> 8;
      g = (g0 * a0 + g1 * a1) >> 8;
      r = (r0 * a0 + r1 * a1) >> 8;
     
      color = 0xff000000 + (b<<16) + (g<<8) + r;
      }*/
    return color;
}